

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_execute(lua_State *L)

{
  double *pdVar1;
  int iVar2;
  char *__command;
  size_t *in_RDI;
  int stat;
  lua_State *unaff_retaddr;
  char *cmd;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined8 in_stack_fffffffffffffff8;
  
  __command = luaL_optlstring(unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                              (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                              in_RDI);
  iVar2 = system(__command);
  pdVar1 = (double *)in_RDI[3];
  in_RDI[3] = (size_t)(pdVar1 + 1);
  *pdVar1 = (double)iVar2;
  return 1;
}

Assistant:

LJLIB_CF(os_execute)
{
#if LJ_NO_SYSTEM
#if LJ_52
  errno = ENOSYS;
  return luaL_fileresult(L, 0, NULL);
#else
  lua_pushinteger(L, -1);
  return 1;
#endif
#else
  const char *cmd = luaL_optstring(L, 1, NULL);
  int stat = system(cmd);
#if LJ_52
  if (cmd)
    return luaL_execresult(L, stat);
  setboolV(L->top++, 1);
#else
  setintV(L->top++, stat);
#endif
  return 1;
#endif
}